

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

void __thiscall
QGles2Buffer::fullDynamicBufferUpdateForCurrentFrame
          (QGles2Buffer *this,void *bufferData,quint32 size)

{
  bool bVar1;
  char *__dest;
  uint in_EDX;
  void *in_RSI;
  long in_RDI;
  QRhiGles2 *rhiD;
  quint32 copySize;
  GLuint in_stack_ffffffffffffffc8;
  UsageFlag in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar2;
  QOpenGLFunctions *this_00;
  
  if (in_EDX == 0) {
    in_EDX = *(uint *)(in_RDI + 0x38);
  }
  uVar2 = in_EDX;
  bVar1 = QFlags<QRhiBuffer::UsageFlag>::testFlag
                    ((QFlags<QRhiBuffer::UsageFlag> *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc);
  if (bVar1) {
    __dest = QByteArray::data((QByteArray *)CONCAT44(uVar2,in_stack_ffffffffffffffd0));
    memcpy(__dest,in_RSI,(ulong)in_EDX);
  }
  else {
    this_00 = *(QOpenGLFunctions **)(in_RDI + 8);
    QOpenGLFunctions::glBindBuffer
              ((QOpenGLFunctions *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    QOpenGLFunctions::glBufferSubData
              (this_00,(GLenum)((ulong)in_RDI >> 0x20),CONCAT44(uVar2,in_stack_ffffffffffffffd0),
               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),(void *)0x92c629);
  }
  return;
}

Assistant:

void QGles2Buffer::fullDynamicBufferUpdateForCurrentFrame(const void *bufferData, quint32 size)
{
    const quint32 copySize = size > 0 ? size : m_size;
    if (!m_usage.testFlag(UniformBuffer)) {
        QRHI_RES_RHI(QRhiGles2);
        rhiD->f->glBindBuffer(targetForDataOps, buffer);
        rhiD->f->glBufferSubData(targetForDataOps, 0, copySize, bufferData);
    } else {
        memcpy(data.data(), bufferData, copySize);
    }
}